

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# questpgr.c
# Opt level: O2

void load_qtlist(void)

{
  uint uVar1;
  int iVar2;
  qtmsg *pqVar3;
  char (*__s2) [3];
  undefined8 *puVar4;
  long lVar5;
  int n_classes;
  char qt_classes [16] [3];
  long qt_offsets [16];
  
  msg_file = dlb_fopen("quest.dat","r");
  if (msg_file == (dlb *)0x0) {
    panic("CANNOT OPEN QUEST TEXT FILE %s.","quest.dat");
  }
  Fread(&n_classes,4,1,msg_file);
  __s2 = qt_classes;
  Fread(__s2,3,n_classes,msg_file);
  Fread(qt_offsets,8,n_classes,msg_file);
  qt_list_1 = 0;
  qt_list_0 = 0;
  lVar5 = 0;
  do {
    if (n_classes <= lVar5) {
      if ((qt_list_0 == 0) || (qt_list_1 == 0)) {
        impossible("load_qtlist: cannot load quest text.");
      }
      return;
    }
    uVar1 = (byte)(*__s2)[0] - 0x2d;
    if (uVar1 == 0) {
      uVar1 = (uint)(byte)(*__s2)[1];
    }
    puVar4 = &qt_list_0;
    if (uVar1 == 0) {
LAB_0021bf1b:
      pqVar3 = construct_qtlist(qt_offsets[lVar5]);
      *puVar4 = pqVar3;
    }
    else {
      iVar2 = strncmp(urole.filecode,*__s2,3);
      puVar4 = &qt_list_1;
      if (iVar2 == 0) goto LAB_0021bf1b;
    }
    lVar5 = lVar5 + 1;
    __s2 = __s2 + 1;
  } while( true );
}

Assistant:

void load_qtlist(void)
{
	int	n_classes, i;
	char	qt_classes[N_HDR][LEN_HDR];
	long	qt_offsets[N_HDR];

	msg_file = dlb_fopen(QTEXT_FILE, RDBMODE);
	if (!msg_file)
	    panic("CANNOT OPEN QUEST TEXT FILE %s.", QTEXT_FILE);

	/*
	 * Read in the number of classes, then the ID's & offsets for
	 * each header.
	 */
	Fread(&n_classes, sizeof(int), 1, msg_file);
	Fread(&qt_classes[0][0], sizeof(char)*LEN_HDR, n_classes, msg_file);
	Fread(qt_offsets, sizeof(long), n_classes, msg_file);

	/*
	 * Now construct the message lists for quick reference later
	 * on when we are actually paging the messages out.
	 */

	qt_list.common = qt_list.chrole = NULL;

	for (i = 0; i < n_classes; i++) {
	    if (!strncmp(COMMON_ID, qt_classes[i], LEN_HDR))
	    	qt_list.common = construct_qtlist(qt_offsets[i]);
	    else if (!strncmp(urole.filecode, qt_classes[i], LEN_HDR))
	    	qt_list.chrole = construct_qtlist(qt_offsets[i]);
	}

	if (!qt_list.common || !qt_list.chrole)
	    impossible("load_qtlist: cannot load quest text.");
	return;	/* no ***DON'T*** close the msg_file */
}